

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void BeginEmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,
                   FuncInfo *funcInfo)

{
  Scope *this;
  code *pcVar1;
  FuncInfo *this_00;
  bool bVar2;
  bool bVar3;
  RegSlot RVar4;
  uint uVar5;
  uint C0;
  undefined4 *puVar6;
  ByteCodeWriter *pBVar7;
  ParseNodeFnc *pPVar8;
  ParseNodeBlock *pPVar9;
  ParseNodeCatch *pPVar10;
  ParseNodeWith *pPVar11;
  Scope *scope_1;
  ParseNodePtr pnodeScope;
  RegSlot tmpInnerEnvReg;
  RegSlot frameDisplayLoc;
  RegSlot RStack_38;
  bool isGlobalEvalBlockScope;
  int scopeSlotCount;
  int scopeIndex;
  RegSlot scopeLocation;
  Scope *scope;
  DebuggerScope *debuggerScope;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeBlock *pnodeBlock_local;
  
  scope = (Scope *)0x0;
  debuggerScope = (DebuggerScope *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeBlock;
  bVar2 = BlockHasOwnScope(pnodeBlock,byteCodeGenerator);
  if (bVar2) {
    _scopeIndex = (Scope *)(byteCodeGenerator_local->m_writer).m_labelOffsets;
    ByteCodeGenerator::PushScope((ByteCodeGenerator *)funcInfo_local,_scopeIndex);
    scopeSlotCount = Scope::GetLocation(_scopeIndex);
    bVar2 = Scope::GetMustInstantiate(_scopeIndex);
    if (bVar2) {
      if (scopeSlotCount != -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2ff,"(scopeLocation == Js::Constants::NoRegister)",
                           "scopeLocation == Js::Constants::NoRegister");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      RVar4 = FuncInfo::FirstInnerScopeReg((FuncInfo *)debuggerScope);
      uVar5 = Scope::GetInnerScopeIndex(_scopeIndex);
      scopeSlotCount = RVar4 + uVar5;
      bVar2 = Scope::GetIsObject(_scopeIndex);
      if (bVar2) {
        scope = (Scope *)ByteCodeGenerator::RecordStartScopeObject
                                   ((ByteCodeGenerator *)funcInfo_local,
                                    (ParseNode *)byteCodeGenerator_local,DiagBlockScopeInObject,
                                    scopeSlotCount,(int *)0x0);
        pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        uVar5 = Scope::GetInnerScopeIndex(_scopeIndex);
        Js::ByteCodeWriter::Unsigned1(pBVar7,NewBlockScope,uVar5);
      }
      else {
        RStack_38 = 0xffffffff;
        scope = (Scope *)ByteCodeGenerator::RecordStartScopeObject
                                   ((ByteCodeGenerator *)funcInfo_local,
                                    (ParseNode *)byteCodeGenerator_local,DiagBlockScopeInSlot,
                                    scopeSlotCount,(int *)&stack0xffffffffffffffc8);
        uVar5 = Scope::GetScopeSlotCount(_scopeIndex);
        pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        C0 = Scope::GetInnerScopeIndex(_scopeIndex);
        Js::ByteCodeWriter::Num3(pBVar7,NewInnerScopeSlots,C0,uVar5 + 2,RStack_38);
      }
    }
    else {
      scope = (Scope *)ByteCodeGenerator::RecordStartScopeObject
                                 ((ByteCodeGenerator *)funcInfo_local,
                                  (ParseNode *)byteCodeGenerator_local,DiagBlockScopeDirect,
                                  0xffffffff,(int *)0x0);
    }
    bVar2 = Scope::IsGlobalEvalBlockScope(_scopeIndex);
    pnodeScope._4_4_ = 0xffffffff;
    pnodeScope._0_4_ = 0xffffffff;
    scope_1 = byteCodeGenerator_local->globalScope;
    while (scope_1 != (Scope *)0x0) {
      switch(*(undefined1 *)&scope_1->enclosingScope) {
      case 0x55:
        pPVar8 = ParseNode::AsParseNodeFnc((ParseNode *)scope_1);
        bVar3 = ParseNodeFnc::IsDeclaration(pPVar8);
        if (bVar3) {
          if (pnodeScope._4_4_ == 0xffffffff) {
            if (*(int *)&debuggerScope[2].field_0x14 == -1) {
              pnodeScope._4_4_ = FuncInfo::GetEnvRegister((FuncInfo *)debuggerScope);
            }
            else {
              pnodeScope._4_4_ = *(RegSlot *)&debuggerScope[2].field_0x14;
            }
            pnodeScope._0_4_ = FuncInfo::AcquireTmpRegister((FuncInfo *)debuggerScope);
            pnodeScope._4_4_ =
                 ByteCodeGenerator::PrependLocalScopes
                           ((ByteCodeGenerator *)funcInfo_local,pnodeScope._4_4_,(RegSlot)pnodeScope
                            ,(FuncInfo *)debuggerScope);
          }
          this_00 = funcInfo_local;
          pPVar8 = ParseNode::AsParseNodeFnc((ParseNode *)scope_1);
          ByteCodeGenerator::DefineOneFunction
                    ((ByteCodeGenerator *)this_00,pPVar8,(FuncInfo *)debuggerScope,true,
                     pnodeScope._4_4_,0xffffffff);
        }
        if (bVar2) {
          FuncInfo::ReleaseLoc((FuncInfo *)debuggerScope,(ParseNode *)scope_1);
          *(undefined4 *)((long)&scope_1->scopeInfo + 4) = 0xffffffff;
        }
        pPVar8 = ParseNode::AsParseNodeFnc((ParseNode *)scope_1);
        scope_1 = (Scope *)pPVar8->pnodeNext;
        break;
      case 0x62:
        pPVar9 = ParseNode::AsParseNodeBlock((ParseNode *)scope_1);
        scope_1 = (Scope *)pPVar9->pnodeNext;
        break;
      case 100:
        pPVar11 = ParseNode::AsParseNodeWith((ParseNode *)scope_1);
        scope_1 = (Scope *)pPVar11->pnodeNext;
        break;
      case 0x6a:
        pPVar10 = ParseNode::AsParseNodeCatch((ParseNode *)scope_1);
        scope_1 = (Scope *)pPVar10->pnodeNext;
      }
    }
    if ((RegSlot)pnodeScope != 0xffffffff) {
      FuncInfo::ReleaseTmpRegister((FuncInfo *)debuggerScope,(RegSlot)pnodeScope);
    }
  }
  else {
    this = (Scope *)(byteCodeGenerator_local->m_writer).m_labelOffsets;
    if (this == (Scope *)0x0) {
      scope = (Scope *)ByteCodeGenerator::RecordStartScopeObject
                                 ((ByteCodeGenerator *)funcInfo_local,
                                  (ParseNode *)byteCodeGenerator_local,DiagBlockScopeInSlot,
                                  0xffffffff,(int *)0x0);
    }
    else {
      bVar2 = Scope::GetMustInstantiate(this);
      if (bVar2) {
        scope = (Scope *)ByteCodeGenerator::RecordStartScopeObject
                                   ((ByteCodeGenerator *)funcInfo_local,
                                    (ParseNode *)byteCodeGenerator_local,DiagBlockScopeInObject,
                                    0xffffffff,(int *)0x0);
      }
      else {
        scope = (Scope *)ByteCodeGenerator::RecordStartScopeObject
                                   ((ByteCodeGenerator *)funcInfo_local,
                                    (ParseNode *)byteCodeGenerator_local,DiagBlockScopeDirect,
                                    0xffffffff,(int *)0x0);
      }
    }
  }
  ByteCodeGenerator::InitBlockScopedContent
            ((ByteCodeGenerator *)funcInfo_local,(ParseNodeBlock *)byteCodeGenerator_local,
             (DebuggerScope *)scope,(FuncInfo *)debuggerScope);
  return;
}

Assistant:

void BeginEmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Js::DebuggerScope* debuggerScope = nullptr;

    if (BlockHasOwnScope(pnodeBlock, byteCodeGenerator))
    {
        Scope *scope = pnodeBlock->scope;
        byteCodeGenerator->PushScope(scope);

        Js::RegSlot scopeLocation = scope->GetLocation();
        if (scope->GetMustInstantiate())
        {
            Assert(scopeLocation == Js::Constants::NoRegister);
            scopeLocation = funcInfo->FirstInnerScopeReg() + scope->GetInnerScopeIndex();

            if (scope->GetIsObject())
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInObject, scopeLocation);

                byteCodeGenerator->Writer()->Unsigned1(Js::OpCode::NewBlockScope, scope->GetInnerScopeIndex());
            }
            else
            {
                int scopeIndex = Js::DebuggerScope::InvalidScopeIndex;
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInSlot, scopeLocation, &scopeIndex);

                // TODO: Handle heap enumeration
                int scopeSlotCount = scope->GetScopeSlotCount();
                byteCodeGenerator->Writer()->Num3(Js::OpCode::NewInnerScopeSlots, scope->GetInnerScopeIndex(), scopeSlotCount + Js::ScopeSlots::FirstSlotIndex, scopeIndex);
            }
        }
        else
        {
            // In the direct register access case, there is no block scope emitted but we can still track
            // the start and end offset of the block.  The location registers for let/const variables will still be
            // captured along with this range in InitBlockScopedContent().
            debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeDirect);
        }

        bool const isGlobalEvalBlockScope = scope->IsGlobalEvalBlockScope();
        Js::RegSlot frameDisplayLoc = Js::Constants::NoRegister;
        Js::RegSlot tmpInnerEnvReg = Js::Constants::NoRegister;
        ParseNodePtr pnodeScope;
        for (pnodeScope = pnodeBlock->pnodeScopes; pnodeScope;)
        {
            switch (pnodeScope->nop)
            {
            case knopFncDecl:
                if (pnodeScope->AsParseNodeFnc()->IsDeclaration())
                {
                    // The frameDisplayLoc register's lifetime has to be controlled by this function. We can't let
                    // it be released by DefineOneFunction, because further iterations of this loop can allocate
                    // temps, and we can't let frameDisplayLoc be re-purposed until this loop completes.
                    // So we'll supply a temp that we allocate and release here.
                    if (frameDisplayLoc == Js::Constants::NoRegister)
                    {
                        if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
                        {
                            frameDisplayLoc = funcInfo->frameDisplayRegister;
                        }
                        else
                        {
                            frameDisplayLoc = funcInfo->GetEnvRegister();
                        }
                        tmpInnerEnvReg = funcInfo->AcquireTmpRegister();
                        frameDisplayLoc = byteCodeGenerator->PrependLocalScopes(frameDisplayLoc, tmpInnerEnvReg, funcInfo);
                    }
                    byteCodeGenerator->DefineOneFunction(pnodeScope->AsParseNodeFnc(), funcInfo, true, frameDisplayLoc);
                }

                // If this is the global eval block scope, the function is actually assigned to the global
                // so we don't need to keep the registers.
                if (isGlobalEvalBlockScope)
                {
                    funcInfo->ReleaseLoc(pnodeScope);
                    pnodeScope->location = Js::Constants::NoRegister;
                }
                pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
                break;
            }
        }

        if (tmpInnerEnvReg != Js::Constants::NoRegister)
        {
            funcInfo->ReleaseTmpRegister(tmpInnerEnvReg);
        }
    }
    else
    {
        Scope *scope = pnodeBlock->scope;
        if (scope)
        {
            if (scope->GetMustInstantiate())
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInObject);
            }
            else
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeDirect);
            }
        }
        else
        {
            debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInSlot);
        }
    }

    byteCodeGenerator->InitBlockScopedContent(pnodeBlock, debuggerScope, funcInfo);
}